

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QImage>::moveAppend(QGenericArrayOps<QImage> *this,QImage *b,QImage *e)

{
  QImage *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QImage *in_RDI;
  QImage *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QImage>::begin((QArrayDataPointer<QImage> *)0x297247);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QImage::QImage(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      in_RDI->d = (QImageData *)
                  ((long)&(in_RDI->d->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int>._M_i + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }